

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O3

idx_t __thiscall
duckdb::ListColumnData::ScanCount
          (ListColumnData *this,ColumnScanState *state,Vector *result,idx_t count,
          idx_t result_offset)

{
  vector<duckdb::ColumnScanState,_true> *this_00;
  PhysicalType PVar1;
  long lVar2;
  __pthread_internal_list *p_Var3;
  __pthread_internal_list *p_Var4;
  idx_t iVar5;
  int iVar6;
  idx_t count_00;
  reference pvVar7;
  Vector *pVVar8;
  pointer pCVar9;
  undefined4 extraout_var;
  InternalException *pIVar10;
  ulong uVar11;
  long *plVar12;
  idx_t iVar13;
  ColumnData *pCVar14;
  long lVar15;
  idx_t iVar16;
  long lVar17;
  Vector offset_vector;
  UnifiedVectorFormat offsets;
  string local_118;
  undefined1 local_f8 [24];
  undefined1 local_e0 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  undefined8 local_80;
  UnifiedVectorFormat local_78;
  
  if (result_offset != 0) {
    pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
    local_e0._0_8_ = local_e0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e0,"ListColumnData::ScanCount not supported with result_offset > 0",
               "");
    InternalException::InternalException(pIVar10,(string *)local_e0);
    __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (count == 0) {
    count_00 = 0;
  }
  else {
    LogicalType::LogicalType((LogicalType *)local_f8,UBIGINT);
    Vector::Vector((Vector *)local_e0,(LogicalType *)local_f8,count);
    pCVar14 = (ColumnData *)local_f8;
    LogicalType::~LogicalType((LogicalType *)pCVar14);
    count_00 = ColumnData::ScanVector(pCVar14,state,(Vector *)local_e0,count,SCAN_FLAT_VECTOR,0);
    this_00 = &state->child_states;
    pCVar14 = (ColumnData *)this_00;
    pvVar7 = vector<duckdb::ColumnScanState,_true>::operator[](this_00,0);
    ColumnData::ScanVector(pCVar14,pvVar7,result,count,SCAN_FLAT_VECTOR,0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat((Vector *)local_e0,count_00,&local_78);
    lVar2 = *(long *)local_78.sel;
    if (lVar2 == 0) {
      uVar11 = count_00 - 1;
    }
    else {
      uVar11 = (ulong)*(uint *)(lVar2 + -4 + count_00 * 4);
    }
    p_Var3 = ((__pthread_internal_list **)local_78.data)[uVar11];
    p_Var4 = (__pthread_internal_list *)state->last_offset;
    if (count_00 != 0) {
      plVar12 = (long *)(result->data + 8);
      iVar13 = 0;
      lVar15 = 0;
      do {
        iVar16 = iVar13;
        if (lVar2 != 0) {
          iVar16 = (idx_t)*(uint *)(lVar2 + iVar13 * 4);
        }
        plVar12[-1] = lVar15;
        lVar17 = (long)((__pthread_internal_list **)local_78.data)[iVar16] +
                 (-(long)p_Var4 - lVar15);
        *plVar12 = lVar17;
        lVar15 = lVar15 + lVar17;
        iVar13 = iVar13 + 1;
        plVar12 = plVar12 + 2;
      } while (count_00 != iVar13);
    }
    iVar13 = (long)p_Var3 - (long)p_Var4;
    ListVector::Reserve(result,iVar13);
    if (p_Var3 != p_Var4) {
      pVVar8 = ListVector::GetEntry(result);
      PVar1 = (pVVar8->type).physical_type_;
      if ((PVar1 != STRUCT) && (PVar1 != ARRAY)) {
        pvVar7 = vector<duckdb::ColumnScanState,_true>::operator[](this_00,1);
        iVar16 = pvVar7->row_index;
        pCVar9 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
                 operator->(&this->child_column);
        iVar5 = pCVar9->start;
        pCVar9 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
                 operator->(&this->child_column);
        iVar6 = (*pCVar9->_vptr_ColumnData[3])(pCVar9);
        if (CONCAT44(extraout_var,iVar6) + iVar5 < iVar16 + iVar13) {
          pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,
                     "ListColumnData::ScanCount - internal list scan offset is out of range","");
          InternalException::InternalException(pIVar10,&local_118);
          __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      pCVar9 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->(&this->child_column);
      pvVar7 = vector<duckdb::ColumnScanState,_true>::operator[](this_00,1);
      (*pCVar9->_vptr_ColumnData[0xc])(pCVar9,pvVar7,pVVar8,iVar13,0);
    }
    state->last_offset = (idx_t)p_Var3;
    ListVector::SetListSize(result,iVar13);
    if ((_Head_base<0UL,_duckdb::UpdateSegment_*,_false>)
        local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Head_base<0UL,_duckdb::UpdateSegment_*,_false>)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80);
    }
    if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
    }
    if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)(local_e0 + 8));
  }
  return count_00;
}

Assistant:

idx_t ListColumnData::ScanCount(ColumnScanState &state, Vector &result, idx_t count, idx_t result_offset) {
	if (result_offset > 0) {
		throw InternalException("ListColumnData::ScanCount not supported with result_offset > 0");
	}
	if (count == 0) {
		return 0;
	}
	// updates not supported for lists
	D_ASSERT(!updates);

	Vector offset_vector(LogicalType::UBIGINT, count);
	idx_t scan_count = ScanVector(state, offset_vector, count, ScanVectorType::SCAN_FLAT_VECTOR);
	D_ASSERT(scan_count > 0);
	validity.ScanCount(state.child_states[0], result, count);

	UnifiedVectorFormat offsets;
	offset_vector.ToUnifiedFormat(scan_count, offsets);
	auto data = UnifiedVectorFormat::GetData<uint64_t>(offsets);
	auto last_entry = data[offsets.sel->get_index(scan_count - 1)];

	// shift all offsets so they are 0 at the first entry
	auto result_data = FlatVector::GetData<list_entry_t>(result);
	auto base_offset = state.last_offset;
	idx_t current_offset = 0;
	for (idx_t i = 0; i < scan_count; i++) {
		auto offset_index = offsets.sel->get_index(i);
		result_data[i].offset = current_offset;
		result_data[i].length = data[offset_index] - current_offset - base_offset;
		current_offset += result_data[i].length;
	}

	D_ASSERT(last_entry >= base_offset);
	idx_t child_scan_count = last_entry - base_offset;
	ListVector::Reserve(result, child_scan_count);

	if (child_scan_count > 0) {
		auto &child_entry = ListVector::GetEntry(result);
		if (child_entry.GetType().InternalType() != PhysicalType::STRUCT &&
		    child_entry.GetType().InternalType() != PhysicalType::ARRAY &&
		    state.child_states[1].row_index + child_scan_count > child_column->start + child_column->GetMaxEntry()) {
			throw InternalException("ListColumnData::ScanCount - internal list scan offset is out of range");
		}
		child_column->ScanCount(state.child_states[1], child_entry, child_scan_count);
	}
	state.last_offset = last_entry;

	ListVector::SetListSize(result, child_scan_count);
	return scan_count;
}